

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

void mg_value_destroy_ca(mg_value *val,mg_allocator *allocator)

{
  if (val == (mg_value *)0x0) {
    return;
  }
  switch(val->type) {
  case MG_VALUE_TYPE_STRING:
  case MG_VALUE_TYPE_DATE:
  case MG_VALUE_TYPE_TIME:
  case MG_VALUE_TYPE_LOCAL_TIME:
  case MG_VALUE_TYPE_DATE_TIME:
  case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
  case MG_VALUE_TYPE_LOCAL_DATE_TIME:
  case MG_VALUE_TYPE_DURATION:
  case MG_VALUE_TYPE_POINT_2D:
  case MG_VALUE_TYPE_POINT_3D:
    if ((val->field_1).string_v != (mg_string *)0x0) {
      mg_allocator_free(allocator,(val->field_1).string_v);
    }
    break;
  case MG_VALUE_TYPE_LIST:
    mg_list_destroy_ca((val->field_1).list_v,allocator);
    break;
  case MG_VALUE_TYPE_MAP:
    mg_map_destroy_ca((val->field_1).map_v,allocator);
    break;
  case MG_VALUE_TYPE_NODE:
    mg_node_destroy_ca((val->field_1).node_v,allocator);
    break;
  case MG_VALUE_TYPE_RELATIONSHIP:
    mg_relationship_destroy_ca((val->field_1).relationship_v,allocator);
    break;
  case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
    mg_unbound_relationship_destroy_ca((val->field_1).unbound_relationship_v,allocator);
    break;
  case MG_VALUE_TYPE_PATH:
    mg_path_destroy_ca((val->field_1).path_v,allocator);
  }
  mg_allocator_free(allocator,val);
  return;
}

Assistant:

void mg_value_destroy_ca(mg_value *val, mg_allocator *allocator) {
  if (!val) {
    return;
  }
  switch (val->type) {
    case MG_VALUE_TYPE_NULL:
    case MG_VALUE_TYPE_BOOL:
    case MG_VALUE_TYPE_INTEGER:
    case MG_VALUE_TYPE_FLOAT:
      break;
    case MG_VALUE_TYPE_DATE:
      mg_date_destroy_ca(val->date_v, allocator);
      break;
    case MG_VALUE_TYPE_TIME:
      mg_time_destroy_ca(val->time_v, allocator);
      break;
    case MG_VALUE_TYPE_LOCAL_TIME:
      mg_local_time_destroy_ca(val->local_time_v, allocator);
      break;
    case MG_VALUE_TYPE_DATE_TIME:
      mg_date_time_destroy_ca(val->date_time_v, allocator);
      break;
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      mg_date_time_zone_id_destroy_ca(val->date_time_zone_id_v, allocator);
      break;
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      mg_local_date_time_destroy_ca(val->local_date_time_v, allocator);
      break;
    case MG_VALUE_TYPE_DURATION:
      mg_duration_destroy_ca(val->duration_v, allocator);
      break;
    case MG_VALUE_TYPE_POINT_2D:
      mg_point_2d_destroy_ca(val->point_2d_v, allocator);
      break;
    case MG_VALUE_TYPE_POINT_3D:
      mg_point_3d_destroy_ca(val->point_3d_v, allocator);
      break;
    case MG_VALUE_TYPE_STRING:
      mg_string_destroy_ca(val->string_v, allocator);
      break;
    case MG_VALUE_TYPE_LIST:
      mg_list_destroy_ca(val->list_v, allocator);
      break;
    case MG_VALUE_TYPE_MAP:
      mg_map_destroy_ca(val->map_v, allocator);
      break;
    case MG_VALUE_TYPE_NODE:
      mg_node_destroy_ca(val->node_v, allocator);
      break;
    case MG_VALUE_TYPE_RELATIONSHIP:
      mg_relationship_destroy_ca(val->relationship_v, allocator);
      break;
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      mg_unbound_relationship_destroy_ca(val->unbound_relationship_v,
                                         allocator);
      break;
    case MG_VALUE_TYPE_PATH:
      mg_path_destroy_ca(val->path_v, allocator);
      break;
    case MG_VALUE_TYPE_UNKNOWN:
      break;
  }
  mg_allocator_free(allocator, val);
}